

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_analyze.cpp
# Opt level: O0

string * __thiscall front::word::Word::get_token_string_abi_cxx11_(Word *this)

{
  int *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string
            ((string *)in_RDI,(string *)(Token_strs_abi_cxx11_ + (long)*in_RSI * 0x20));
  return in_RDI;
}

Assistant:

string Word::get_token_string() { return Token_strs[(int)token_value]; }